

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O3

Vec3 __thiscall
anon_unknown.dwarf_5c268::MapDriver::predictFuturePosition(MapDriver *this,float predictionTime)

{
  Color *in_R8;
  uint uVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar2;
  float extraout_XMM0_Da_01;
  float fVar3;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float in_XMM1_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar8;
  undefined8 uVar7;
  float fVar9;
  undefined1 auVar10 [16];
  Vec3 VVar11;
  Color futurePositionColor;
  Vec3 local_58;
  undefined1 local_48 [16];
  Vec3 local_30;
  Color local_20;
  
  if (this->curvedSteering == true) {
    fVar3 = (this->super_SimpleVehicle)._curvature;
    fVar4 = 1.0 / fVar3;
    uVar1 = -(uint)(ABS(fVar3) < 1e-05);
    fVar9 = (float)(~uVar1 & (uint)fVar4 | uVar1 & 0x47c35000);
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[2])(this);
    fVar5 = fVar4 * fVar9;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
    fVar6 = fVar9 * extraout_XMM0_Da + extraout_XMM0_Da_00;
    fVar8 = fVar9 * extraout_XMM0_Db + extraout_XMM0_Db_00;
    fVar5 = fVar5 + fVar4 * fVar9;
    fVar3 = (float)(&DAT_001480e0)[fVar9 < 0.0];
    fVar2 = fVar9 * fVar3 * -6.2831855;
    fVar4 = fVar3;
    local_58.x = fVar6;
    local_58.y = fVar8;
    local_58.z = fVar5;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[0x1b])(this);
    fVar3 = extraout_XMM0_Da_01 * predictionTime * fVar3;
    fVar9 = fVar2 * 0.25;
    if (fVar3 <= 0.0) {
      fVar4 = (float)((uint)-fVar9 & -(uint)(fVar9 < -fVar3));
      auVar10._0_4_ = ~-(uint)(fVar9 < -fVar3) & (uint)fVar3;
      auVar10._4_4_ = extraout_XMM0_Db_01;
      auVar10._8_4_ = extraout_XMM0_Dc;
      auVar10._12_4_ = extraout_XMM0_Dd;
      local_48 = auVar10 | ZEXT416((uint)fVar4);
    }
    else {
      if (fVar3 <= fVar9) {
        fVar9 = fVar3;
      }
      local_48 = ZEXT416((uint)fVar9);
    }
    fVar2 = (local_48._0_4_ * 6.2831855) / fVar2;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
    fVar3 = sinf(fVar2);
    fVar9 = cosf(fVar2);
    in_XMM1_Da = ((fVar4 - fVar5) * fVar9 - fVar3 * (extraout_XMM0_Da_04 - fVar6)) + fVar5;
    fVar2 = 0.5;
    OpenSteer::Color::Color(&local_20,0.5,0.5,0.6,1.0);
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
    local_30.z = fVar2;
    annotationXZArc(this,&local_30,&local_58,(float)local_48._0_4_,(int)&local_20,in_R8);
    uVar7 = CONCAT44((extraout_XMM0_Db_04 - fVar8) + fVar8,
                     (extraout_XMM0_Da_04 - fVar6) * fVar9 + (fVar4 - fVar5) * fVar3 + fVar6);
  }
  else {
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
    fVar3 = in_XMM1_Da;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[0x1a])(this);
    uVar7 = CONCAT44(predictionTime * extraout_XMM0_Db_03 + extraout_XMM0_Db_02,
                     predictionTime * extraout_XMM0_Da_03 + extraout_XMM0_Da_02);
    in_XMM1_Da = fVar3 * predictionTime + in_XMM1_Da;
  }
  VVar11.z = in_XMM1_Da;
  VVar11.x = (float)(int)uVar7;
  VVar11.y = (float)(int)((ulong)uVar7 >> 0x20);
  return VVar11;
}

Assistant:

Vec3 predictFuturePosition (const float predictionTime) const
        {
            if (curvedSteering)
            {
                // QQQ this chunk of code is repeated in far too many places,
                // QQQ it has to be moved inside some utility
                // QQQ 
                // QQQ and now, worse, I rearranged it to try the "limit arc
                // QQQ angle" trick
                const float signedRadius = 1 / nonZeroCurvatureQQQ ();
                const Vec3 localCenterOfCurvature = side () * signedRadius;
                const Vec3 center = position () + localCenterOfCurvature;
                const float sign = signedRadius < 0 ? 1.0f : -1.0f;
                const float arcRadius = signedRadius * -sign;
                const float twoPi = 2 * OPENSTEER_M_PI;
                const float circumference = twoPi * arcRadius;
                const float rawLength = speed() * predictionTime * sign;
                const float arcLength = arcLengthLimit (rawLength,
                                                        circumference * 0.25f);
                const float arcAngle = twoPi * arcLength / circumference;

                const Vec3 spoke = position () - center;
                const Vec3 newSpoke = spoke.rotateAboutGlobalY (arcAngle);
                const Vec3 prediction = newSpoke + center;

                // QQQ unify with annotatePathFollowing
                const Color futurePositionColor (0.5f, 0.5f, 0.6f);
                annotationXZArc (position (), center, arcLength, 20, 
                                 futurePositionColor);
                return prediction;
            }
            else
            {
                return position() + (velocity() * predictionTime);
            }
        }